

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

char * __thiscall google::protobuf::internal::LongSooRep::elements(LongSooRep *this)

{
  char **v1;
  void **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_40;
  Voidify local_29;
  void *local_28;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  char *ret;
  LongSooRep *this_local;
  
  absl_log_internal_check_op_result =
       (Nullable<const_char_*>)(this->elements_int & 0xfffffffffffffff8);
  ret = (char *)this;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<char*>
                 (&absl_log_internal_check_op_result);
  local_28 = (void *)0x0;
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<decltype(nullptr)>(&local_28);
  local_20 = absl::lts_20250127::log_internal::Check_NEImpl<char*,decltype(nullptr)>
                       (v1,v2,"ret != nullptr");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
               ,0x99,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  return absl_log_internal_check_op_result;
}

Assistant:

char* elements() const {
    auto ret = reinterpret_cast<char*>(elements_int & kSooPtrMask);
    ABSL_DCHECK_NE(ret, nullptr);
    return ret;
  }